

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int experimental_prof_recent_alloc_max_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  return 2;
}

Assistant:

static int
experimental_prof_recent_alloc_max_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	if (!(config_prof && opt_prof)) {
		ret = ENOENT;
		goto label_return;
	}

	ssize_t old_max;
	if (newp != NULL) {
		if (newlen != sizeof(ssize_t)) {
			ret = EINVAL;
			goto label_return;
		}
		ssize_t max = *(ssize_t *)newp;
		if (max < -1) {
			ret = EINVAL;
			goto label_return;
		}
		old_max = prof_recent_alloc_max_ctl_write(tsd, max);
	} else {
		old_max = prof_recent_alloc_max_ctl_read();
	}
	READ(old_max, ssize_t);

	ret = 0;

label_return:
	return ret;
}